

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_ubjson_object(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *this)

{
  bool bVar1;
  undefined1 uVar2;
  long in_RDI;
  size_t in_stack_00000008;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_00000010;
  size_t i_1;
  size_t i;
  string_t key;
  pair<unsigned_long,_int> size_and_type;
  pair<unsigned_long,_int> *in_stack_00000090;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_00000098;
  bool in_stack_000000bf;
  string_t *in_stack_000000c0;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_000000c8;
  char_int_type in_stack_000002b4;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_000002b8;
  undefined2 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined1 in_stack_ffffffffffffff8c;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff91;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  undefined1 in_stack_ffffffffffffff94;
  byte in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *local_58;
  string local_40 [32];
  pair<unsigned_long,_int> local_20;
  bool local_1;
  
  std::pair<unsigned_long,_int>::pair<unsigned_long,_int,_true>(&local_20);
  bVar1 = get_ubjson_size_type(in_stack_00000098,in_stack_00000090);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_1 = false;
    goto LAB_00e0e729;
  }
  std::__cxx11::string::string(local_40);
  if ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       *)local_20.first ==
      (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       *)0xffffffffffffffff) {
    uVar2 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::start_object(in_stack_00000010,in_stack_00000008);
    if (((uVar2 ^ 0xff) & 1) == 0) {
      while (*(int *)(in_RDI + 0x10) != 0x7d) {
        bVar1 = get_ubjson_string(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf);
        bVar3 = 1;
        if (bVar1) {
          in_stack_ffffffffffffff8b =
               json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff97,
                                 CONCAT16(in_stack_ffffffffffffff96,
                                          CONCAT15(in_stack_ffffffffffffff95,
                                                   CONCAT14(in_stack_ffffffffffffff94,
                                                            CONCAT13(in_stack_ffffffffffffff93,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))),
                     (string_t *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(uVar2,CONCAT15(bVar1,CONCAT14(1,CONCAT13(
                                                  in_stack_ffffffffffffff8b,
                                                  CONCAT12(in_stack_ffffffffffffff8a,
                                                           in_stack_ffffffffffffff88)))))));
          bVar3 = in_stack_ffffffffffffff8b ^ 0xff;
        }
        if ((bVar3 & 1) != 0) {
          local_1 = false;
          goto LAB_00e0e71f;
        }
        in_stack_ffffffffffffff8a =
             parse_ubjson_internal(in_stack_ffffffffffffffa0,SUB81((ulong)in_RDI >> 0x38,0));
        if (((in_stack_ffffffffffffff8a ^ 0xff) & 1) != 0) {
          local_1 = false;
          goto LAB_00e0e71f;
        }
        get_ignore_noop((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)CONCAT17(in_stack_ffffffffffffff97,
                                    CONCAT16(in_stack_ffffffffffffff96,
                                             CONCAT15(in_stack_ffffffffffffff95,
                                                      CONCAT14(in_stack_ffffffffffffff94,
                                                               CONCAT13(in_stack_ffffffffffffff93,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))));
        std::__cxx11::string::clear();
      }
      goto LAB_00e0e703;
    }
    local_1 = false;
  }
  else {
    in_stack_ffffffffffffff97 =
         json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::start_object(in_stack_00000010,in_stack_00000008);
    if (((in_stack_ffffffffffffff97 ^ 0xff) & 1) == 0) {
      if (local_20.second == 0) {
        for (this_00 = (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)0x0; this_00 < local_20.first;
            this_00 = (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)((long)&(this_00->ia).current + 1)) {
          in_stack_ffffffffffffff92 =
               get_ubjson_string(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf);
          in_stack_ffffffffffffff91 = 1;
          if ((bool)in_stack_ffffffffffffff92) {
            in_stack_ffffffffffffff90 =
                 json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(in_stack_ffffffffffffff96,
                                            CONCAT15(in_stack_ffffffffffffff95,
                                                     CONCAT14(in_stack_ffffffffffffff94,
                                                              CONCAT13(in_stack_ffffffffffffff93,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(1,in_stack_ffffffffffffff90))))))),
                       (string_t *)
                       CONCAT17(in_stack_ffffffffffffff8f,
                                CONCAT16(in_stack_ffffffffffffff8e,
                                         CONCAT15(in_stack_ffffffffffffff8d,
                                                  CONCAT14(in_stack_ffffffffffffff8c,
                                                           CONCAT13(in_stack_ffffffffffffff8b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff8a,
                                                  in_stack_ffffffffffffff88)))))));
            in_stack_ffffffffffffff91 = in_stack_ffffffffffffff90 ^ 0xff;
          }
          if ((in_stack_ffffffffffffff91 & 1) != 0) {
            local_1 = false;
            goto LAB_00e0e71f;
          }
          in_stack_ffffffffffffff8f = parse_ubjson_internal(this_00,SUB81((ulong)in_RDI >> 0x38,0));
          if (((in_stack_ffffffffffffff8f ^ 0xff) & 1) != 0) {
            local_1 = false;
            goto LAB_00e0e71f;
          }
          std::__cxx11::string::clear();
        }
      }
      else {
        for (local_58 = (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)0x0; local_58 < local_20.first;
            local_58 = (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)((long)&(local_58->ia).current + 1)) {
          in_stack_ffffffffffffff96 =
               get_ubjson_string(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf);
          in_stack_ffffffffffffff95 = 1;
          if ((bool)in_stack_ffffffffffffff96) {
            in_stack_ffffffffffffff94 =
                 json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(in_stack_ffffffffffffff96,
                                            CONCAT15(1,CONCAT14(in_stack_ffffffffffffff94,
                                                                CONCAT13(in_stack_ffffffffffffff93,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))),
                       (string_t *)
                       CONCAT17(in_stack_ffffffffffffff8f,
                                CONCAT16(in_stack_ffffffffffffff8e,
                                         CONCAT15(in_stack_ffffffffffffff8d,
                                                  CONCAT14(in_stack_ffffffffffffff8c,
                                                           CONCAT13(in_stack_ffffffffffffff8b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff8a,
                                                  in_stack_ffffffffffffff88)))))));
            in_stack_ffffffffffffff95 = in_stack_ffffffffffffff94 ^ 0xff;
          }
          if ((in_stack_ffffffffffffff95 & 1) != 0) {
            local_1 = false;
            goto LAB_00e0e71f;
          }
          in_stack_ffffffffffffff93 = get_ubjson_value(in_stack_000002b8,in_stack_000002b4);
          if (((in_stack_ffffffffffffff93 ^ 0xff) & 1) != 0) {
            local_1 = false;
            goto LAB_00e0e71f;
          }
          std::__cxx11::string::clear();
        }
      }
LAB_00e0e703:
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::end_object((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff97,
                                         CONCAT16(in_stack_ffffffffffffff96,
                                                  CONCAT15(in_stack_ffffffffffffff95,
                                                           CONCAT14(in_stack_ffffffffffffff94,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                            );
    }
    else {
      local_1 = false;
    }
  }
LAB_00e0e71f:
  std::__cxx11::string::~string(local_40);
LAB_00e0e729:
  return (bool)(local_1 & 1);
}

Assistant:

bool get_ubjson_object()
    {
        std::pair<std::size_t, char_int_type> size_and_type;
        if (JSON_HEDLEY_UNLIKELY(!get_ubjson_size_type(size_and_type)))
        {
            return false;
        }

        string_t key;
        if (size_and_type.first != string_t::npos)
        {
            if (JSON_HEDLEY_UNLIKELY(!sax->start_object(size_and_type.first)))
            {
                return false;
            }

            if (size_and_type.second != 0)
            {
                for (std::size_t i = 0; i < size_and_type.first; ++i)
                {
                    if (JSON_HEDLEY_UNLIKELY(!get_ubjson_string(key) || !sax->key(key)))
                    {
                        return false;
                    }
                    if (JSON_HEDLEY_UNLIKELY(!get_ubjson_value(size_and_type.second)))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
            else
            {
                for (std::size_t i = 0; i < size_and_type.first; ++i)
                {
                    if (JSON_HEDLEY_UNLIKELY(!get_ubjson_string(key) || !sax->key(key)))
                    {
                        return false;
                    }
                    if (JSON_HEDLEY_UNLIKELY(!parse_ubjson_internal()))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
        }
        else
        {
            if (JSON_HEDLEY_UNLIKELY(!sax->start_object(static_cast<std::size_t>(-1))))
            {
                return false;
            }

            while (current != '}')
            {
                if (JSON_HEDLEY_UNLIKELY(!get_ubjson_string(key, false) || !sax->key(key)))
                {
                    return false;
                }
                if (JSON_HEDLEY_UNLIKELY(!parse_ubjson_internal()))
                {
                    return false;
                }
                get_ignore_noop();
                key.clear();
            }
        }

        return sax->end_object();
    }